

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O3

void __thiscall rotate_y::rotate_y(rotate_y *this,shared_ptr<hittable> *object,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  double dVar9;
  double dVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  double y;
  double dVar19;
  double dVar20;
  vec3 tester;
  aabb local_78;
  point3 local_48;
  point3 local_28;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__rotate_y_00128ba0;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var8 = (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8
  ;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  (this->bbox).x.min = INFINITY;
  (this->bbox).x.max = -INFINITY;
  (this->bbox).y.min = INFINITY;
  (this->bbox).y.max = -INFINITY;
  (this->bbox).z.min = INFINITY;
  (this->bbox).z.max = -INFINITY;
  dVar9 = (angle * 3.141592653589793) / 180.0;
  dVar10 = sin(dVar9);
  this->sin_theta = dVar10;
  dVar9 = cos(dVar9);
  this->cos_theta = dVar9;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_78);
  (this->bbox).z.min = local_78.z.min;
  (this->bbox).z.max = local_78.z.max;
  (this->bbox).y.min = local_78.y.min;
  (this->bbox).y.max = local_78.y.max;
  (this->bbox).x.min = local_78.x.min;
  (this->bbox).x.max = local_78.x.max;
  local_28.e[0] = INFINITY;
  local_28.e[1] = INFINITY;
  local_28.e[2] = INFINITY;
  local_48.e[0] = -INFINITY;
  local_48.e[1] = -INFINITY;
  local_48.e[2] = -INFINITY;
  dVar9 = (this->bbox).x.max;
  dVar10 = (this->bbox).x.min;
  dVar1 = (this->bbox).y.max;
  dVar2 = (this->bbox).y.min;
  dVar3 = (this->bbox).z.max;
  dVar4 = (this->bbox).z.min;
  dVar5 = this->sin_theta;
  dVar6 = this->cos_theta;
  uVar14 = 0;
  bVar11 = true;
  do {
    bVar12 = bVar11;
    dVar18 = (double)(uVar14 ^ 1) * dVar10 + (double)uVar14 * dVar9;
    uVar14 = 0;
    bVar11 = true;
    do {
      bVar13 = bVar11;
      uVar16 = 0;
      bVar11 = true;
      do {
        bVar15 = bVar11;
        dVar19 = (double)(uVar16 ^ 1) * dVar4 + (double)uVar16 * dVar3;
        local_78.x.min = dVar5 * dVar19 + dVar6 * dVar18;
        local_78.x.max = (double)(uVar14 ^ 1) * dVar2 + (double)uVar14 * dVar1;
        local_78.y.min = dVar19 * dVar6 + dVar18 * -dVar5;
        lVar17 = 0;
        do {
          dVar19 = local_28.e[lVar17];
          dVar7 = (&local_78.x.min)[lVar17];
          dVar20 = dVar7;
          if (dVar19 <= dVar7) {
            dVar20 = dVar19;
          }
          local_28.e[lVar17] =
               (double)(~-(ulong)NAN(dVar19) & (ulong)dVar20 | -(ulong)NAN(dVar19) & (ulong)dVar7);
          dVar19 = local_48.e[lVar17];
          dVar20 = dVar7;
          if (dVar7 <= dVar19) {
            dVar20 = dVar19;
          }
          local_48.e[lVar17] =
               (double)(~-(ulong)NAN(dVar19) & (ulong)dVar20 | -(ulong)NAN(dVar19) & (ulong)dVar7);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        uVar16 = 1;
        bVar11 = false;
      } while (bVar15);
      uVar14 = 1;
      bVar11 = false;
    } while (bVar13);
    uVar14 = 1;
    bVar11 = false;
  } while (bVar12);
  aabb::aabb(&local_78,&local_28,&local_48);
  (this->bbox).z.min = local_78.z.min;
  (this->bbox).z.max = local_78.z.max;
  (this->bbox).y.min = local_78.y.min;
  (this->bbox).y.max = local_78.y.max;
  (this->bbox).x.min = local_78.x.min;
  (this->bbox).x.max = local_78.x.max;
  return;
}

Assistant:

rotate_y(shared_ptr<hittable> object, double angle) : object(object) {
        auto radians = degrees_to_radians(angle);
        sin_theta = std::sin(radians);
        cos_theta = std::cos(radians);
        bbox = object->bounding_box();

        point3 min( infinity,  infinity,  infinity);
        point3 max(-infinity, -infinity, -infinity);

        for (int i = 0; i < 2; i++) {
            for (int j = 0; j < 2; j++) {
                for (int k = 0; k < 2; k++) {
                    auto x = i*bbox.x.max + (1-i)*bbox.x.min;
                    auto y = j*bbox.y.max + (1-j)*bbox.y.min;
                    auto z = k*bbox.z.max + (1-k)*bbox.z.min;

                    auto newx =  cos_theta*x + sin_theta*z;
                    auto newz = -sin_theta*x + cos_theta*z;

                    vec3 tester(newx, y, newz);

                    for (int c = 0; c < 3; c++) {
                        min[c] = std::fmin(min[c], tester[c]);
                        max[c] = std::fmax(max[c], tester[c]);
                    }
                }
            }
        }

        bbox = aabb(min, max);
    }